

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

int s2pred::TriageCompareLineSin2Distance<long_double>
              (Vector3<long_double> *x,Vector3<long_double> *a0,Vector3<long_double> *a1,
              longdouble r2,Vector3<long_double> *n,longdouble n1,longdouble n2)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  int iVar7;
  long lVar8;
  longdouble in_ST0;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble lVar12;
  longdouble lVar13;
  longdouble lVar14;
  longdouble lVar15;
  longdouble local_8c;
  longdouble local_80;
  
  iVar7 = -1;
  if (r2 < (longdouble)2.0) {
    lVar10 = ((longdouble)1 + r2 * (longdouble)-0.25) * r2 * n2;
    lVar11 = *(longdouble *)a0->c_;
    lVar12 = *(longdouble *)(a0->c_ + 1);
    lVar13 = *(longdouble *)x->c_;
    lVar1 = *(longdouble *)(x->c_ + 1);
    lVar2 = *(longdouble *)(a0->c_ + 2);
    lVar3 = *(longdouble *)(x->c_ + 2);
    lVar14 = (lVar2 - lVar3) * (lVar2 - lVar3) +
             (lVar12 - lVar1) * (lVar12 - lVar1) + (lVar11 - lVar13) * (lVar11 - lVar13);
    lVar4 = *(longdouble *)a1->c_;
    lVar5 = *(longdouble *)(a1->c_ + 1);
    lVar6 = *(longdouble *)(a1->c_ + 2);
    lVar15 = (lVar6 - lVar3) * (lVar6 - lVar3) +
             (lVar5 - lVar1) * (lVar5 - lVar1) + (lVar4 - lVar13) * (lVar4 - lVar13);
    lVar9 = lVar12;
    local_8c = lVar2;
    local_80 = lVar11;
    if (lVar15 <= lVar14) {
      lVar9 = lVar5;
      local_8c = lVar6;
      local_80 = lVar4;
      if ((lVar14 == lVar15) && (!NAN(lVar14) && !NAN(lVar15))) {
        lVar8 = 0;
        do {
          lVar4 = *(longdouble *)((long)a0->c_ + lVar8);
          lVar5 = *(longdouble *)((long)a1->c_ + lVar8);
          if (lVar4 != lVar5) {
            if (lVar4 < lVar5) goto LAB_0021f0bc;
            break;
          }
          lVar8 = lVar8 + 0x10;
        } while (lVar8 != 0x30);
      }
    }
    lVar12 = lVar9;
    lVar2 = local_8c;
    lVar11 = local_80;
LAB_0021f0bc:
    local_80 = lVar11;
    local_8c = lVar2;
    lVar11 = *(longdouble *)(n->c_ + 1) * (lVar1 - lVar12) +
             (longdouble)0 + *(longdouble *)n->c_ * (lVar13 - local_80) +
             *(longdouble *)(n->c_ + 2) * (lVar3 - local_8c);
    sqrtl();
    in_ST0 = (n1 * (longdouble)6.964101615137754 + (longdouble)6.153480596427404e-15) *
             (longdouble)5.421011e-20 * in_ST0;
    lVar12 = lVar10 * (*(longdouble *)(x->c_ + 2) * *(longdouble *)(x->c_ + 2) +
                      *(longdouble *)(x->c_ + 1) * *(longdouble *)(x->c_ + 1) +
                      *(longdouble *)x->c_ * *(longdouble *)x->c_);
    lVar13 = lVar11 * lVar11 * (longdouble)2.1684043e-19 +
             (ABS(lVar11) + ABS(lVar11) + in_ST0) * in_ST0 +
             lVar10 * (longdouble)3.2526065e-19 + (longdouble)2.1684043e-19 * lVar12;
    lVar12 = lVar11 * lVar11 - lVar12;
    iVar7 = 1;
    if (lVar12 <= lVar13) {
      iVar7 = -(uint)(lVar12 < -lVar13);
    }
  }
  return iVar7;
}

Assistant:

int TriageCompareLineSin2Distance(const Vector3<T>& x, const Vector3<T>& a0,
                                  const Vector3<T>& a1, T r2,
                                  const Vector3<T>& n, T n1, T n2) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // The minimum distance is to a point on the edge interior.  Since the true
  // distance to the edge is always less than 90 degrees, we can return
  // immediately if the limit is 90 degrees or larger.
  if (r2 >= 2.0) return -1;  // distance < limit

  // Otherwise we compute sin^2(distance to edge) to get the best accuracy
  // when the distance limit is small (e.g., S2::kIntersectionError).
  T n2sin2_r = n2 * r2 * (1 - 0.25 * r2);
  T n2sin2_r_error = 6 * T_ERR * n2sin2_r;
  T ax2, xDn = (x - GetClosestVertex(x, a0, a1, &ax2)).DotProd(n);
  T xDn2 = xDn * xDn;
  const T c1 = (((3.5 + 2 * sqrt(3)) * n1 + 32 * sqrt(3) * DBL_ERR) *
                T_ERR * sqrt(ax2));
  T xDn2_error = 4 * T_ERR * xDn2 + (2 * fabs(xDn) + c1) * c1;

  // If we are using extended precision, then it is worthwhile to recompute
  // the length of X more accurately.  Otherwise we use the fact that X is
  // guaranteed to be unit length to with a tolerance of 4 * DBL_ERR.
  if (T_ERR < DBL_ERR) {
    n2sin2_r *= x.Norm2();
    n2sin2_r_error += 4 * T_ERR * n2sin2_r;
  } else {
    n2sin2_r_error += 8 * DBL_ERR * n2sin2_r;
  }
  T diff = xDn2 - n2sin2_r;
  T error = xDn2_error + n2sin2_r_error;
  return (diff > error) ? 1 : (diff < -error) ? -1 : 0;
}